

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void resolveAlias(Parse *pParse,ExprList *pEList,int iCol,Expr *pExpr,char *zType,int nSubquery)

{
  byte *pbVar1;
  ushort uVar2;
  sqlite3 *db;
  ExprList_item *pEVar3;
  char *__src;
  char cVar4;
  u16 uVar5;
  undefined4 uVar6;
  uint uVar7;
  Expr *pExpr_00;
  char *pcVar8;
  long lVar9;
  Expr *pEVar10;
  Expr *pEVar11;
  byte bVar12;
  Walker local_58;
  
  bVar12 = 0;
  pEVar10 = pEList->a[iCol].pExpr;
  db = pParse->db;
  pExpr_00 = exprDup(db,pEVar10,0,(u8 **)0x0);
  if (pExpr_00 != (Expr *)0x0) {
    if ((pEVar10->op != 0x98) && (*zType != 'G')) {
      if (0 < nSubquery) {
        local_58.walkerDepth = 0;
        local_58.bSelectDepthFirst = '\0';
        local_58._29_3_ = 0;
        local_58.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        local_58.pParse = (Parse *)0x0;
        local_58.xExprCallback = incrAggDepth;
        local_58.u._4_4_ = 0;
        local_58.u.i = nSubquery;
        sqlite3WalkExpr(&local_58,pExpr_00);
      }
      pExpr_00 = sqlite3PExpr(pParse,0x18,pExpr_00,(Expr *)0x0,(Token *)0x0);
      if (pExpr_00 == (Expr *)0x0) {
        return;
      }
      pEVar3 = pEList->a;
      uVar2 = pEVar3[iCol].iAlias;
      uVar7 = (uint)uVar2;
      if (uVar2 == 0) {
        uVar7 = pParse->nAlias + 1;
        pParse->nAlias = uVar7;
        pEVar3[iCol].iAlias = (u16)uVar7;
      }
      pExpr_00->iTable = uVar7 & 0xffff;
    }
    if (pExpr->op == '\\') {
      pExpr_00 = sqlite3ExprAddCollateString(pParse,pExpr_00,(pExpr->u).zToken);
    }
    pbVar1 = (byte *)((long)&pExpr->flags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    sqlite3ExprDelete(db,pExpr);
    pEVar10 = pExpr_00;
    pEVar11 = pExpr;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      cVar4 = pEVar10->affinity;
      uVar5 = pEVar10->flags;
      uVar6 = *(undefined4 *)&pEVar10->field_0x4;
      pEVar11->op = pEVar10->op;
      pEVar11->affinity = cVar4;
      pEVar11->flags = uVar5;
      *(undefined4 *)&pEVar11->field_0x4 = uVar6;
      pEVar10 = (Expr *)((long)pEVar10 + (ulong)bVar12 * -0x10 + 8);
      pEVar11 = (Expr *)((long)pEVar11 + (ulong)bVar12 * -0x10 + 8);
    }
    if (((pExpr->flags & 0x400) == 0) && (__src = (pExpr->u).zToken, __src != (char *)0x0)) {
      lVar9 = 0;
      do {
        pcVar8 = __src + lVar9;
        lVar9 = lVar9 + 1;
      } while (*pcVar8 != '\0');
      uVar7 = ((int)lVar9 - 1U & 0x3fffffff) + 1;
      pcVar8 = (char *)sqlite3DbMallocRaw(db,uVar7);
      if (pcVar8 != (char *)0x0) {
        memcpy(pcVar8,__src,(ulong)uVar7);
      }
      (pExpr->u).zToken = pcVar8;
      pExpr->flags2 = pExpr->flags2 | 1;
    }
    sqlite3DbFree(db,pExpr_00);
  }
  return;
}

Assistant:

static void resolveAlias(
  Parse *pParse,         /* Parsing context */
  ExprList *pEList,      /* A result set */
  int iCol,              /* A column in the result set.  0..pEList->nExpr-1 */
  Expr *pExpr,           /* Transform this into an alias to the result set */
  const char *zType,     /* "GROUP" or "ORDER" or "" */
  int nSubquery          /* Number of subqueries that the label is moving */
){
  Expr *pOrig;           /* The iCol-th column of the result set */
  Expr *pDup;            /* Copy of pOrig */
  sqlite3 *db;           /* The database connection */

  assert( iCol>=0 && iCol<pEList->nExpr );
  pOrig = pEList->a[iCol].pExpr;
  assert( pOrig!=0 );
  assert( pOrig->flags & EP_Resolved );
  db = pParse->db;
  pDup = sqlite3ExprDup(db, pOrig, 0);
  if( pDup==0 ) return;
  if( pOrig->op!=TK_COLUMN && zType[0]!='G' ){
    incrAggFunctionDepth(pDup, nSubquery);
    pDup = sqlite3PExpr(pParse, TK_AS, pDup, 0, 0);
    if( pDup==0 ) return;
    if( pEList->a[iCol].iAlias==0 ){
      pEList->a[iCol].iAlias = (u16)(++pParse->nAlias);
    }
    pDup->iTable = pEList->a[iCol].iAlias;
  }
  if( pExpr->op==TK_COLLATE ){
    pDup = sqlite3ExprAddCollateString(pParse, pDup, pExpr->u.zToken);
  }

  /* Before calling sqlite3ExprDelete(), set the EP_Static flag. This 
  ** prevents ExprDelete() from deleting the Expr structure itself,
  ** allowing it to be repopulated by the memcpy() on the following line.
  ** The pExpr->u.zToken might point into memory that will be freed by the
  ** sqlite3DbFree(db, pDup) on the last line of this block, so be sure to
  ** make a copy of the token before doing the sqlite3DbFree().
  */
  ExprSetProperty(pExpr, EP_Static);
  sqlite3ExprDelete(db, pExpr);
  memcpy(pExpr, pDup, sizeof(*pExpr));
  if( !ExprHasProperty(pExpr, EP_IntValue) && pExpr->u.zToken!=0 ){
    assert( (pExpr->flags & (EP_Reduced|EP_TokenOnly))==0 );
    pExpr->u.zToken = sqlite3DbStrDup(db, pExpr->u.zToken);
    pExpr->flags2 |= EP2_MallocedToken;
  }
  sqlite3DbFree(db, pDup);
}